

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validatePoolingLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  NeuralNetworkLayer *pNVar1;
  bool bVar2;
  PoolingPaddingTypeCase PVar3;
  PoolingLayerParams *this_00;
  string *__rhs;
  Result local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_148 [8];
  string err;
  string local_120;
  Result local_100;
  allocator local_d1;
  string local_d0;
  Result local_b0;
  Result local_88;
  Result local_50;
  undefined1 local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *r;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  Result::Result(__return_storage_ptr__);
  validateInputCount(&local_50,local_20,1,1);
  Result::operator=(__return_storage_ptr__,&local_50);
  Result::~Result(&local_50);
  bVar2 = Result::good(__return_storage_ptr__);
  if (bVar2) {
    validateOutputCount(&local_88,local_20,1,1);
    Result::operator=(__return_storage_ptr__,&local_88);
    Result::~Result(&local_88);
    bVar2 = Result::good(__return_storage_ptr__);
    pNVar1 = local_20;
    if (bVar2) {
      if ((this->ndArrayInterpretation & 1U) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_d0,"Pooling",&local_d1);
        validateInputOutputRankEquality(&local_b0,pNVar1,&local_d0,&this->blobNameToRank);
        Result::operator=(__return_storage_ptr__,&local_b0);
        Result::~Result(&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        bVar2 = Result::good(__return_storage_ptr__);
        pNVar1 = local_20;
        if (!bVar2) {
          return __return_storage_ptr__;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_120,"Pooling",(allocator *)(err.field_2._M_local_buf + 0xf));
        validateRankCount(&local_100,pNVar1,&local_120,4,-1,&this->blobNameToRank);
        Result::operator=(__return_storage_ptr__,&local_100);
        Result::~Result(&local_100);
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator((allocator<char> *)(err.field_2._M_local_buf + 0xf));
        bVar2 = Result::good(__return_storage_ptr__);
        if (!bVar2) {
          return __return_storage_ptr__;
        }
      }
      this_00 = Specification::NeuralNetworkLayer::pooling(local_20);
      PVar3 = Specification::PoolingLayerParams::PoolingPaddingType_case(this_00);
      if (PVar3 == POOLINGPADDINGTYPE_NOT_SET) {
        __rhs = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
        std::operator+(&local_168,"Padding type for the pooling layer \'",__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_148,&local_168,"\' is not set.");
        std::__cxx11::string::~string((string *)&local_168);
        Result::Result(&local_190,INVALID_MODEL_PARAMETERS,(string *)local_148);
        Result::operator=(__return_storage_ptr__,&local_190);
        Result::~Result(&local_190);
        std::__cxx11::string::~string((string *)local_148);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validatePoolingLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (!r.good()) {return r;}

    r = validateOutputCount(layer, 1, 1);
    if (!r.good()) {return r;}

    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Pooling", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Pooling", 4, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    // We need to check if the PoolingPaddingType is set
    if (layer.pooling().PoolingPaddingType_case() == Specification::PoolingLayerParams::PoolingPaddingTypeCase::POOLINGPADDINGTYPE_NOT_SET) {
        std::string err = "Padding type for the pooling layer '" + layer.name() + "' is not set.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return r;
}